

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_detect_magic(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  long in_RCX;
  long in_RDX;
  AFFECT_DATA af;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  CHAR_DATA *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  
  bVar1 = is_affected_by(in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
  if (bVar1) {
    if (in_RCX == in_RDX) {
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
    else {
      act(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
          (void *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
          in_stack_ffffffffffffff68,0);
    }
  }
  else {
    init_affect((AFFECT_DATA *)0x6155d3);
    get_spell_aftype(in_stack_ffffffffffffff68);
    std::pow<int,int>(0,0x61562c);
    affect_to_char((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (AFFECT_DATA *)in_stack_ffffffffffffff68);
    send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (in_RDX != in_RCX) {
      send_to_char(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    }
  }
  return;
}

Assistant:

void spell_detect_magic(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (is_affected_by(victim, AFF_DETECT_MAGIC))
	{
		if (victim == ch)
			send_to_char("You can already sense magical auras.\n\r", ch);
		else
			act("$N can already detect magic.", ch, nullptr, victim, TO_CHAR);
		return;
	}

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.aftype = get_spell_aftype(ch);
	af.type = sn;
	af.level = level;
	af.duration = level;
	af.modifier = 0;
	af.location = APPLY_NONE;

	SET_BIT(af.bitvector, AFF_DETECT_MAGIC);

	af.mod_name = MOD_VISION;
	affect_to_char(victim, &af);

	send_to_char("Your eyes tingle.\n\r", victim);

	if (ch != victim)
		send_to_char("Ok.\n\r", ch);
}